

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

IntersecRes * intersectionT(Segment *segment,Triangle *triangle)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  IntersecRes *in_RDI;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  uVar2 = (segment->b).x;
  uVar6 = (segment->b).y;
  fVar12 = (float)uVar6 - (segment->a).y;
  fVar14 = (float)uVar2 - (segment->a).x;
  fVar1 = (segment->a).z;
  fVar18 = (segment->b).z - fVar1;
  fVar10 = SQRT(fVar18 * fVar18 + fVar14 * fVar14 + fVar12 * fVar12);
  fVar14 = fVar14 / fVar10;
  fVar12 = fVar12 / fVar10;
  fVar18 = fVar18 / fVar10;
  uVar3 = (triangle->y).x;
  uVar7 = (triangle->y).y;
  fVar10 = (triangle->x).x;
  fVar23 = (triangle->x).y;
  fVar15 = (float)uVar3 - fVar10;
  fVar19 = (float)uVar7 - fVar23;
  fVar25 = (triangle->x).z;
  uVar4 = (triangle->z).x;
  uVar8 = (triangle->z).y;
  fVar16 = (float)uVar4 - fVar10;
  fVar17 = (float)uVar8 - fVar23;
  fVar20 = (triangle->z).z - fVar25;
  fVar11 = fVar12 * fVar20 - fVar18 * fVar17;
  fVar13 = fVar18 * fVar16 - fVar20 * fVar14;
  fVar22 = fVar14 * fVar17 - fVar16 * fVar12;
  fVar21 = (triangle->y).z - fVar25;
  fVar24 = fVar21 * fVar22 + fVar15 * fVar11 + fVar19 * fVar13;
  if (1.1920929e-07 <= ABS(fVar24)) {
    fVar24 = 1.0 / fVar24;
    uVar5 = (segment->a).x;
    uVar9 = (segment->a).y;
    fVar10 = (float)uVar5 - fVar10;
    fVar23 = (float)uVar9 - fVar23;
    fVar25 = fVar1 - fVar25;
    fVar11 = (fVar22 * fVar25 + fVar11 * fVar10 + fVar13 * fVar23) * fVar24;
    if ((0.0 <= fVar11) && (fVar11 <= 1.0)) {
      fVar13 = fVar23 * fVar21 - fVar25 * fVar19;
      fVar25 = fVar25 * fVar15 - fVar21 * fVar10;
      fVar23 = fVar10 * fVar19 - fVar15 * fVar23;
      fVar10 = (fVar18 * fVar23 + fVar14 * fVar13 + fVar12 * fVar25) * fVar24;
      if ((0.0 <= fVar10) &&
         ((fVar11 + fVar10 <= 1.0 &&
          (fVar24 = fVar24 * (fVar20 * fVar23 + fVar16 * fVar13 + fVar17 * fVar25), 0.0 < fVar24))))
      {
        in_RDI->exists = true;
        (in_RDI->point).x = fVar14 * fVar24 + (float)uVar5;
        (in_RDI->point).y = fVar12 * fVar24 + (float)uVar9;
        (in_RDI->point).z = fVar1 + fVar18 * fVar24;
        in_RDI->t = fVar24;
        return in_RDI;
      }
    }
  }
  in_RDI->exists = false;
  *(undefined3 *)&in_RDI->field_0x1 = 0;
  (in_RDI->point).x = 0.0;
  (in_RDI->point).y = 0.0;
  (in_RDI->point).z = 0.0;
  in_RDI->t = 0.0;
  return in_RDI;
}

Assistant:

IntersecRes intersectionT(Segment const& segment, Triangle const& triangle)
{
  Vector const D = normalize(segment.b - segment.a);

  Vector e1 = triangle.y - triangle.x;
  Vector e2 = triangle.z - triangle.x;

  Vector P = crossProduct(D, e2);
  float det = dotProduct(e1, P);

  if (isCloseToZero(det))
    return {false, {}};

  float inv_det = 1.f / det;
  Vector T = segment.a - triangle.x;
  float u = dotProduct(T, P) * inv_det;
  if (u < 0.f || u > 1.f)
    return {false, {}};

  Vector Q = crossProduct(T, e1);
  float v = dotProduct(D, Q) * inv_det;

  if (v < 0.f || u + v > 1.f)
    return {false, {}};

  float t = dotProduct(e2, Q) * inv_det;
  if (t > 0)
  {
    Point res = segment.a + D * t;
    return {true, res, t};
  }

  return {false, {}};
}